

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

void __thiscall
cfd::core::AbstractTxIn::AbstractTxIn
          (AbstractTxIn *this,Txid *txid,uint32_t index,uint32_t sequence,Script *unlocking_script)

{
  this->_vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_007dad30;
  Txid::Txid(&this->txid_,txid);
  this->vout_ = index;
  Script::Script(&this->unlocking_script_,unlocking_script);
  this->sequence_ = sequence;
  (this->script_witness_)._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007da970;
  (this->script_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->script_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->script_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

AbstractTxIn::AbstractTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script)
    : txid_(txid),
      vout_(index),
      unlocking_script_(unlocking_script),
      sequence_(sequence),
      script_witness_() {
  // do nothing
}